

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Company.cpp
# Opt level: O1

void __thiscall Company::payForService(Company *this)

{
  Employee *this_00;
  int iVar1;
  Address *this_01;
  string *psVar2;
  long lVar3;
  
  iVar1 = Boss::getNumberOfEmployee(this->boss);
  if (0 < iVar1) {
    lVar3 = 0;
    do {
      this_01 = Person::getAddress(&this->employee[lVar3]->super_Person);
      psVar2 = Address::getCity_abi_cxx11_(this_01);
      iVar1 = std::__cxx11::string::compare((char *)psVar2);
      if (iVar1 != 0) {
        this_00 = this->employee[lVar3];
        iVar1 = Employee::getHourWork(this_00);
        Employee::setHourWork(this_00,iVar1 + 7);
      }
      lVar3 = lVar3 + 1;
      iVar1 = Boss::getNumberOfEmployee(this->boss);
    } while (lVar3 < iVar1);
  }
  return;
}

Assistant:

void Company::payForService() {

    int i = 0;
    while(i < boss->getNumberOfEmployee())
    {
        if (employee[i]->getAddress().getCity().compare("tehran") != 0){
            employee[i]->setHourWork((7 + employee[i]->getHourWork()));
        }
        i++;
    }

//    for (int j = 0; j < boss->getNumberOfEmployee(); j++) {
//        if (employee[j]->getAddress().getCity().compare("tehran") != 0) {
//            employee[j]->setHourWork(7 + employee[j]->getHourWork());
//        }
//    }
}